

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void Cmd_playerclasses(FCommandLine *argv,APlayerPawn *who,int key)

{
  long lVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < PlayerClasses.Count; uVar3 = uVar3 + 1) {
    lVar1 = *(long *)((long)&(PlayerClasses.Array)->Type + lVar2);
    Printf("%3d: Class = %s, Name = %s\n",uVar3 & 0xffffffff,
           FName::NameData.NameArray[*(int *)(lVar1 + 0xa0)].Text,*(undefined8 *)(lVar1 + 0x1f0));
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

CCMD (playerclasses)
{
	for (unsigned int i = 0; i < PlayerClasses.Size (); i++)
	{
		Printf ("%3d: Class = %s, Name = %s\n", i,
			PlayerClasses[i].Type->TypeName.GetChars(),
			PlayerClasses[i].Type->DisplayName.GetChars());
	}
}